

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const*const&>
          (pybind11 *this,char **args_)

{
  array<pybind11::object,_1UL> aVar1;
  cast_error *__return_storage_ptr__;
  char *typeid_name;
  array<pybind11::object,_1UL> args;
  string local_58;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::type_caster<char,_void>::cast(*args_,automatic_reference,(handle)0x0);
  if (args._M_elems[0].super_handle.m_ptr == (object)0x0) {
    detail::clean_type_id_abi_cxx11_
              (argtypes._M_elems,(detail *)(_munmap + (*_munmap == '*')),typeid_name);
    __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_58,0);
    cast_error_unable_to_convert_call_arg(__return_storage_ptr__,&local_58,argtypes._M_elems);
    __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tuple::tuple<unsigned_long,_0>((tuple *)this,1);
  aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
  args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
  if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
    (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
    object::~object(args._M_elems);
    return (object)(object)this;
  }
  __assert_fail("PyTuple_Check(result.ptr())",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../cast.h"
                ,0x57d,
                "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char *const &>]"
               );
}

Assistant:

tuple make_tuple(Args &&...args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args{{reinterpret_steal<object>(
        detail::make_caster<Args>::cast(std::forward<Args>(args_), policy, nullptr))...}};
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            throw cast_error_unable_to_convert_call_arg(std::to_string(i));
#else
            std::array<std::string, size> argtypes{{type_id<Args>()...}};
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args) {
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    }
    return result;
}